

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_StageERKNoFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  iVar1 = mriStep_RKCoeffs(step_mem->MRIC,is,step_mem->stage_map,step_mem->Ae_row,step_mem->Ai_row);
  if (iVar1 == 0) {
    *step_mem->cvals = 1.0;
    *step_mem->Xvecs = ark_mem->ycur;
    uVar3 = 0;
    uVar5 = (ulong)(uint)is;
    if (is < 1) {
      uVar5 = uVar3;
    }
    iVar1 = 1;
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      if ((step_mem->explicit_rhs != 0) && (lVar4 = (long)step_mem->stage_map[uVar3], -1 < lVar4)) {
        step_mem->cvals[iVar1] = ark_mem->h * step_mem->Ae_row[lVar4];
        step_mem->Xvecs[iVar1] = step_mem->Fse[lVar4];
        iVar1 = iVar1 + 1;
      }
      if ((step_mem->implicit_rhs != 0) && (lVar4 = (long)step_mem->stage_map[uVar3], -1 < lVar4)) {
        step_mem->cvals[iVar1] = ark_mem->h * step_mem->Ai_row[lVar4];
        step_mem->Xvecs[iVar1] = step_mem->Fsi[lVar4];
        iVar1 = iVar1 + 1;
      }
    }
    iVar2 = N_VLinearCombination(iVar1,step_mem->cvals,step_mem->Xvecs,ark_mem->ycur);
    iVar1 = -0x1c;
    if (iVar2 == 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mriStep_StageERKNoFast(ARKodeMem ark_mem,
                           ARKodeMRIStepMem step_mem, int is)
{
  int retval, j, nvec;

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep ERK stage\n");
#endif

  /* determine effective ERK coefficients (store in cvals) */
  retval = mriStep_RKCoeffs(step_mem->MRIC, is, step_mem->stage_map,
                            step_mem->Ae_row, step_mem->Ai_row);
  if (retval != ARK_SUCCESS) { return(retval); }

  /* call fused vector operation to perform ERK update */
  step_mem->cvals[0] = ONE;
  step_mem->Xvecs[0] = ark_mem->ycur;
  nvec = 1;
  for (j = 0; j < is; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      step_mem->cvals[nvec] = ark_mem->h *
        step_mem->Ae_row[step_mem->stage_map[j]];
      step_mem->Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[j]];
      nvec += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      step_mem->cvals[nvec] = ark_mem->h *
        step_mem->Ai_row[step_mem->stage_map[j]];
      step_mem->Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[j]];
      nvec += 1;
    }
  }
  /* Is there a case where we have an explicit update with Fsi? */

  retval = N_VLinearCombination(nvec, step_mem->cvals,
                                step_mem->Xvecs, ark_mem->ycur);
  if (retval != 0) return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}